

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

void xe::removeEmptyGroups
               (set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                *nodeSet,TestGroup *group)

{
  pointer ppTVar1;
  TestGroup *group_00;
  const_iterator cVar2;
  int ndx;
  long lVar3;
  TestGroup *local_30;
  
  lVar3 = 0;
  do {
    ppTVar1 = (group->m_children).
              super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(group->m_children).
                            super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1) >> 3) <=
        lVar3) {
      local_30 = group;
      std::
      _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
      ::erase((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
               *)nodeSet,(key_type *)&local_30);
      group_00 = (group->super_TestNode).m_parent;
      if (group_00 == (TestGroup *)0x0) {
        return;
      }
      removeEmptyGroups(nodeSet,group_00);
      return;
    }
    local_30 = (TestGroup *)ppTVar1[lVar3];
    cVar2 = std::
            _Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
            ::find((_Rb_tree<const_xe::TestNode_*,_const_xe::TestNode_*,_std::_Identity<const_xe::TestNode_*>,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                    *)nodeSet,(key_type *)&local_30);
    lVar3 = lVar3 + 1;
  } while (cVar2._M_node == (_Base_ptr)(nodeSet + 8));
  return;
}

Assistant:

static void removeEmptyGroups (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	if (!hasChildrenInSet(nodeSet, group))
	{
		nodeSet.erase(group);
		if (group->getParent() != DE_NULL)
			removeEmptyGroups(nodeSet, group->getParent());
	}
}